

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psroipooling.cpp
# Opt level: O0

int __thiscall
ncnn::PSROIPooling::forward
          (PSROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  int *piVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar3;
  float fVar4;
  int index;
  int x;
  int y;
  float sum;
  int area;
  bool is_empty;
  int wend;
  int hend;
  int wstart;
  int hstart;
  float *ptr;
  int pw;
  int ph;
  float *outptr;
  int q;
  float bin_size_h;
  float bin_size_w;
  float roi_h;
  float roi_w;
  float roi_y2;
  float roi_x2;
  float roi_y1;
  float roi_x1;
  float *roi_ptr;
  Mat *top_blob;
  Mat *roi_blob;
  int channels;
  size_t elemsize;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *m;
  Mat *m_1;
  float local_3a0;
  Allocator *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  int _c;
  undefined8 in_stack_fffffffffffffc88;
  Mat *in_stack_fffffffffffffc90;
  int local_32c;
  int local_328;
  float local_324;
  int local_318 [5];
  int local_304;
  int local_300;
  int local_2fc;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined4 local_2e0;
  Allocator *local_2d8;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined8 local_2b8;
  void *local_2b0;
  int local_2a4;
  int local_2a0;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined4 local_278;
  Allocator *local_270;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined8 local_250;
  void *local_248;
  int local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float *local_208;
  reference local_200;
  const_reference local_1f8;
  int local_1ec;
  size_t local_1e8;
  int local_1e0;
  int local_1dc;
  const_reference local_1d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1c0;
  int local_1ac;
  reference local_1a8;
  undefined8 *local_1a0;
  const_reference local_198;
  undefined1 local_18d;
  int local_18c;
  reference local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_168;
  undefined8 *local_158;
  undefined1 local_145;
  int local_144;
  const_reference local_140;
  undefined8 *local_138;
  reference local_128;
  Allocator *local_120;
  int local_114;
  size_t local_110;
  void *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  Allocator *local_e8;
  int local_dc;
  size_t local_d8;
  void *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_68;
  undefined8 *local_48;
  
  _c = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  local_1c8 = in_RDX;
  local_1c0 = in_RSI;
  local_1d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1dc = local_1d8->w;
  local_1e0 = local_1d8->h;
  local_1e8 = local_1d8->elemsize;
  local_1ec = local_1d8->c;
  local_1f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1c0,1);
  if (local_1ec == *(int *)(in_RDI + 0xdc) * *(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd4)) {
    local_200 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1c8,0);
    Mat::create(in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                (int)in_stack_fffffffffffffc88,_c,in_stack_fffffffffffffc78,
                in_stack_fffffffffffffc70);
    local_1a8 = local_200;
    bVar3 = true;
    if (local_200->data != (void *)0x0) {
      local_128 = local_200;
      bVar3 = local_200->cstep * (long)local_200->c == 0;
    }
    if (bVar3) {
      local_1ac = -100;
    }
    else {
      local_198 = local_1f8;
      local_208 = (float *)local_1f8->data;
      local_20c = roundf(*local_208);
      local_20c = local_20c * *(float *)(in_RDI + 0xd8);
      local_210 = roundf(local_208[1]);
      local_210 = local_210 * *(float *)(in_RDI + 0xd8);
      local_214 = roundf(local_208[2] + 1.0);
      local_214 = local_214 * *(float *)(in_RDI + 0xd8);
      local_218 = roundf(local_208[3] + 1.0);
      local_218 = local_218 * *(float *)(in_RDI + 0xd8);
      local_220 = local_214 - local_20c;
      local_224 = 0.1;
      pfVar1 = std::max<float>(&local_220,&local_224);
      local_21c = *pfVar1;
      local_22c = local_218 - local_210;
      local_230 = 0.1;
      pfVar1 = std::max<float>(&local_22c,&local_230);
      local_228 = *pfVar1;
      local_234 = local_21c / (float)*(int *)(in_RDI + 0xd0);
      local_238 = local_228 / (float)*(int *)(in_RDI + 0xd4);
      for (local_23c = 0; local_23c < *(int *)(in_RDI + 0xdc); local_23c = local_23c + 1) {
        local_180 = &local_290;
        local_bc = local_200->w;
        local_c0 = local_200->h;
        local_c4 = local_200->d;
        local_248 = (void *)((long)local_200->data +
                            local_200->cstep * (long)local_23c * local_200->elemsize);
        local_d8 = local_200->elemsize;
        local_dc = local_200->elempack;
        local_e8 = local_200->allocator;
        local_b8 = &local_290;
        local_a8 = (long)local_bc * (long)local_c0 * local_d8;
        local_178 = &local_290;
        local_168 = &local_290;
        local_ac = 0x10;
        local_188 = local_200;
        local_18c = local_23c;
        local_18d = 1;
        local_290 = 0;
        local_280 = 0;
        local_278 = 0;
        local_268 = 0;
        local_264 = 0;
        local_260 = 0;
        local_25c = 0;
        local_258 = 0;
        local_250 = 0;
        local_288 = 0;
        local_d0 = local_248;
        local_48 = local_168;
        local_270 = local_e8;
        for (local_2a0 = 0; local_2a0 < *(int *)(in_RDI + 0xd4); local_2a0 = local_2a0 + 1) {
          for (local_2a4 = 0; local_2a4 < *(int *)(in_RDI + 0xd0); local_2a4 = local_2a4 + 1) {
            local_144 = (local_23c * *(int *)(in_RDI + 0xd4) + local_2a0) * *(int *)(in_RDI + 0xd0)
                        + local_2a4;
            local_138 = &local_2f8;
            local_f4 = local_1d8->w;
            local_f8 = local_1d8->h;
            local_fc = local_1d8->d;
            local_2b0 = (void *)((long)local_1d8->data +
                                local_1d8->cstep * (long)local_144 * local_1d8->elemsize);
            local_110 = local_1d8->elemsize;
            local_114 = local_1d8->elempack;
            local_120 = local_1d8->allocator;
            local_f0 = &local_2f8;
            local_98 = (long)local_f4 * (long)local_f8 * local_110;
            local_1a0 = &local_2f8;
            local_158 = &local_2f8;
            local_9c = 0x10;
            local_140 = local_1d8;
            local_145 = 1;
            local_2f8 = 0;
            local_2e8 = 0;
            local_2e0 = 0;
            local_2d0 = 0;
            local_2cc = 0;
            local_2c8 = 0;
            local_2c4 = 0;
            local_2c0 = 0;
            local_2b8 = 0;
            local_2f0 = 0;
            local_108 = local_2b0;
            local_68 = local_158;
            local_2d8 = local_120;
            fVar4 = floorf(local_210 + (float)local_2a0 * local_238);
            local_2fc = (int)fVar4;
            fVar4 = floorf(local_20c + (float)local_2a4 * local_234);
            local_300 = (int)fVar4;
            fVar4 = ceilf(local_210 + (float)(local_2a0 + 1) * local_238);
            local_304 = (int)fVar4;
            fVar4 = ceilf(local_20c + (float)(local_2a4 + 1) * local_234);
            local_318[4] = (int)fVar4;
            local_318[3] = 0;
            piVar2 = std::max<int>(&local_2fc,local_318 + 3);
            piVar2 = std::min<int>(piVar2,&local_1e0);
            local_2fc = *piVar2;
            local_318[2] = 0;
            piVar2 = std::max<int>(&local_300,local_318 + 2);
            piVar2 = std::min<int>(piVar2,&local_1dc);
            local_300 = *piVar2;
            local_318[1] = 0;
            piVar2 = std::max<int>(&local_304,local_318 + 1);
            piVar2 = std::min<int>(piVar2,&local_1e0);
            local_304 = *piVar2;
            local_318[0] = 0;
            piVar2 = std::max<int>(local_318 + 4,local_318);
            piVar2 = std::min<int>(piVar2,&local_1dc);
            local_318[4] = *piVar2;
            local_324 = 0.0;
            for (local_328 = local_2fc; local_328 < local_304; local_328 = local_328 + 1) {
              for (local_32c = local_300; local_32c < local_318[4]; local_32c = local_32c + 1) {
                local_324 = *(float *)((long)local_2b0 +
                                      (long)(local_328 * local_1dc + local_32c) * 4) + local_324;
              }
            }
            if (local_2fc < local_304 && local_300 < local_318[4]) {
              local_3a0 = local_324 / (float)((local_304 - local_2fc) * (local_318[4] - local_300));
            }
            else {
              local_3a0 = 0.0;
            }
            *(float *)((long)local_248 + (long)local_2a4 * 4) = local_3a0;
          }
          local_248 = (void *)((long)local_248 + (long)*(int *)(in_RDI + 0xd0) * 4);
        }
      }
      local_1ac = 0;
    }
  }
  else {
    local_1ac = -1;
  }
  return local_1ac;
}

Assistant:

int PSROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    if (channels != output_dim * pooled_width * pooled_height)
    {
        // input channel number does not match layer parameters
        return -1;
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, output_dim, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = roundf(roi_ptr[0]) * spatial_scale;
    float roi_y1 = roundf(roi_ptr[1]) * spatial_scale;
    float roi_x2 = roundf(roi_ptr[2] + 1.f) * spatial_scale;
    float roi_y2 = roundf(roi_ptr[3] + 1.f) * spatial_scale;

    float roi_w = std::max(roi_x2 - roi_x1, 0.1f);
    float roi_h = std::max(roi_y2 - roi_y1, 0.1f);

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < output_dim; q++)
    {
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                const float* ptr = bottom_blob.channel((q * pooled_height + ph) * pooled_width + pw);

                int hstart = static_cast<int>(floorf(roi_y1 + ph * bin_size_h));
                int wstart = static_cast<int>(floorf(roi_x1 + pw * bin_size_w));
                int hend = static_cast<int>(ceilf(roi_y1 + (ph + 1) * bin_size_h));
                int wend = static_cast<int>(ceilf(roi_x1 + (pw + 1) * bin_size_w));

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);
                int area = (hend - hstart) * (wend - wstart);

                float sum = 0.f;
                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        sum += ptr[index];
                    }
                }

                outptr[pw] = is_empty ? 0.f : (sum / (float)area);
            }

            outptr += pooled_width;
        }
    }

    return 0;
}